

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O3

void __thiscall Assimp::ExporterPimpl::ExporterPimpl(ExporterPimpl *this)

{
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  *this_00;
  pointer *ppEVar1;
  element_type *__p;
  iterator iVar2;
  ExportFormatEntry local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  this->blob = (aiExportDataBlob *)0x0;
  __p = (element_type *)Intern::AllocateFromAssimpHeap::operator_new(0x20);
  (__p->m_pathStack).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->m_pathStack).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->m_pathStack).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((IOSystem *)&__p->_vptr_IOSystem)->_vptr_IOSystem = (_func_int **)&PTR__IOSystem_0080d8f0;
  (this->mIOSystem).super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
  local_38 = &(this->mIOSystem).super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::DefaultIOSystem*>
            (local_38,(DefaultIOSystem *)__p);
  this->mIsDefaultIOHandler = true;
  this->mProgressHandler = (ProgressHandler *)0x0;
  this->mIsDefaultProgressHandler = true;
  (this->mPostProcessingSteps).
  super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mPostProcessingSteps).
  super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPostProcessingSteps).
  super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mError)._M_dataplus._M_p = (pointer)&(this->mError).field_2;
  (this->mError)._M_string_length = 0;
  (this->mError).field_2._M_local_buf[0] = '\0';
  this_00 = &this->mExporters;
  (this->mExporters).
  super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mExporters).
  super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mExporters).
  super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetPostProcessingStepInstanceList(&this->mPostProcessingSteps);
  local_60.mDescription.id = "collada";
  local_60.mDescription.description = "COLLADA - Digital Asset Exchange Schema";
  local_60.mDescription.fileExtension = "dae";
  local_60.mExportFunction = ExportSceneCollada;
  local_60.mEnforcePP = 0;
  iVar2._M_current =
       (this->mExporters).
       super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = (ulong)(uint)local_60._36_4_ << 0x20;
    ((iVar2._M_current)->mDescription).fileExtension = "dae";
    (iVar2._M_current)->mExportFunction = ExportSceneCollada;
    ((iVar2._M_current)->mDescription).id = "collada";
    ((iVar2._M_current)->mDescription).description = "COLLADA - Digital Asset Exchange Schema";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "x";
  local_60.mDescription.description = "X Files";
  local_60.mDescription.fileExtension = "x";
  local_60.mExportFunction = ExportSceneXFile;
  local_60.mEnforcePP = 0x1800004;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = CONCAT44(local_60._36_4_,0x1800004);
    ((iVar2._M_current)->mDescription).fileExtension = "x";
    (iVar2._M_current)->mExportFunction = ExportSceneXFile;
    ((iVar2._M_current)->mDescription).id = "x";
    ((iVar2._M_current)->mDescription).description = "X Files";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "stp";
  local_60.mDescription.description = "Step Files";
  local_60.mDescription.fileExtension = "stp";
  local_60.mExportFunction = ExportSceneStep;
  local_60.mEnforcePP = 0;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = (ulong)(uint)local_60._36_4_ << 0x20;
    ((iVar2._M_current)->mDescription).fileExtension = "stp";
    (iVar2._M_current)->mExportFunction = ExportSceneStep;
    ((iVar2._M_current)->mDescription).id = "stp";
    ((iVar2._M_current)->mDescription).description = "Step Files";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "obj";
  local_60.mDescription.description = "Wavefront OBJ format";
  local_60.mDescription.fileExtension = "obj";
  local_60.mExportFunction = ExportSceneObj;
  local_60.mEnforcePP = 0x40;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = CONCAT44(local_60._36_4_,0x40);
    ((iVar2._M_current)->mDescription).fileExtension = "obj";
    (iVar2._M_current)->mExportFunction = ExportSceneObj;
    ((iVar2._M_current)->mDescription).id = "obj";
    ((iVar2._M_current)->mDescription).description = "Wavefront OBJ format";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "objnomtl";
  local_60.mDescription.description = "Wavefront OBJ format without material file";
  local_60.mDescription.fileExtension = "obj";
  local_60.mExportFunction = ExportSceneObjNoMtl;
  local_60.mEnforcePP = 0x40;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = CONCAT44(local_60._36_4_,0x40);
    ((iVar2._M_current)->mDescription).fileExtension = "obj";
    (iVar2._M_current)->mExportFunction = ExportSceneObjNoMtl;
    ((iVar2._M_current)->mDescription).id = "objnomtl";
    ((iVar2._M_current)->mDescription).description = "Wavefront OBJ format without material file";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "stl";
  local_60.mDescription.description = "Stereolithography";
  local_60.mDescription.fileExtension = "stl";
  local_60.mExportFunction = ExportSceneSTL;
  local_60.mEnforcePP = 0x128;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = CONCAT44(local_60._36_4_,0x128);
    ((iVar2._M_current)->mDescription).fileExtension = "stl";
    (iVar2._M_current)->mExportFunction = ExportSceneSTL;
    ((iVar2._M_current)->mDescription).id = "stl";
    ((iVar2._M_current)->mDescription).description = "Stereolithography";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "stlb";
  local_60.mDescription.description = "Stereolithography (binary)";
  local_60.mDescription.fileExtension = "stl";
  local_60.mExportFunction = ExportSceneSTLBinary;
  local_60.mEnforcePP = 0x128;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = CONCAT44(local_60._36_4_,0x128);
    ((iVar2._M_current)->mDescription).fileExtension = "stl";
    (iVar2._M_current)->mExportFunction = ExportSceneSTLBinary;
    ((iVar2._M_current)->mDescription).id = "stlb";
    ((iVar2._M_current)->mDescription).description = "Stereolithography (binary)";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "ply";
  local_60.mDescription.description = "Stanford Polygon Library";
  local_60.mDescription.fileExtension = "ply";
  local_60.mExportFunction = ExportScenePly;
  local_60.mEnforcePP = 0x100;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = CONCAT44(local_60._36_4_,0x100);
    ((iVar2._M_current)->mDescription).fileExtension = "ply";
    (iVar2._M_current)->mExportFunction = ExportScenePly;
    ((iVar2._M_current)->mDescription).id = "ply";
    ((iVar2._M_current)->mDescription).description = "Stanford Polygon Library";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "plyb";
  local_60.mDescription.description = "Stanford Polygon Library (binary)";
  local_60.mDescription.fileExtension = "ply";
  local_60.mExportFunction = ExportScenePlyBinary;
  local_60.mEnforcePP = 0x100;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = CONCAT44(local_60._36_4_,0x100);
    ((iVar2._M_current)->mDescription).fileExtension = "ply";
    (iVar2._M_current)->mExportFunction = ExportScenePlyBinary;
    ((iVar2._M_current)->mDescription).id = "plyb";
    ((iVar2._M_current)->mDescription).description = "Stanford Polygon Library (binary)";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "3ds";
  local_60.mDescription.description = "Autodesk 3DS (legacy)";
  local_60.mDescription.fileExtension = "3ds";
  local_60.mExportFunction = ExportScene3DS;
  local_60.mEnforcePP = 0x800a;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = CONCAT44(local_60._36_4_,0x800a);
    ((iVar2._M_current)->mDescription).fileExtension = "3ds";
    (iVar2._M_current)->mExportFunction = ExportScene3DS;
    ((iVar2._M_current)->mDescription).id = "3ds";
    ((iVar2._M_current)->mDescription).description = "Autodesk 3DS (legacy)";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "gltf2";
  local_60.mDescription.description = "GL Transmission Format v. 2";
  local_60.mDescription.fileExtension = "gltf";
  local_60.mExportFunction = ExportSceneGLTF2;
  local_60.mEnforcePP = 0x800a;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = CONCAT44(local_60._36_4_,0x800a);
    ((iVar2._M_current)->mDescription).fileExtension = "gltf";
    (iVar2._M_current)->mExportFunction = ExportSceneGLTF2;
    ((iVar2._M_current)->mDescription).id = "gltf2";
    ((iVar2._M_current)->mDescription).description = "GL Transmission Format v. 2";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "glb2";
  local_60.mDescription.description = "GL Transmission Format v. 2 (binary)";
  local_60.mDescription.fileExtension = "glb";
  local_60.mExportFunction = ExportSceneGLB2;
  local_60.mEnforcePP = 0x800a;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = CONCAT44(local_60._36_4_,0x800a);
    ((iVar2._M_current)->mDescription).fileExtension = "glb";
    (iVar2._M_current)->mExportFunction = ExportSceneGLB2;
    ((iVar2._M_current)->mDescription).id = "glb2";
    ((iVar2._M_current)->mDescription).description = "GL Transmission Format v. 2 (binary)";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "gltf";
  local_60.mDescription.description = "GL Transmission Format";
  local_60.mDescription.fileExtension = "gltf";
  local_60.mExportFunction = ExportSceneGLTF;
  local_60.mEnforcePP = 0x800a;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = CONCAT44(local_60._36_4_,0x800a);
    ((iVar2._M_current)->mDescription).fileExtension = "gltf";
    (iVar2._M_current)->mExportFunction = ExportSceneGLTF;
    ((iVar2._M_current)->mDescription).id = "gltf";
    ((iVar2._M_current)->mDescription).description = "GL Transmission Format";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "glb";
  local_60.mDescription.description = "GL Transmission Format (binary)";
  local_60.mDescription.fileExtension = "glb";
  local_60.mExportFunction = ExportSceneGLB;
  local_60.mEnforcePP = 0x800a;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = CONCAT44(local_60._36_4_,0x800a);
    ((iVar2._M_current)->mDescription).fileExtension = "glb";
    (iVar2._M_current)->mExportFunction = ExportSceneGLB;
    ((iVar2._M_current)->mDescription).id = "glb";
    ((iVar2._M_current)->mDescription).description = "GL Transmission Format (binary)";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "assbin";
  local_60.mDescription.description = "Assimp Binary File";
  local_60.mDescription.fileExtension = "assbin";
  local_60.mExportFunction = ExportSceneAssbin;
  local_60.mEnforcePP = 0;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = (ulong)(uint)local_60._36_4_ << 0x20;
    ((iVar2._M_current)->mDescription).fileExtension = "assbin";
    (iVar2._M_current)->mExportFunction = ExportSceneAssbin;
    ((iVar2._M_current)->mDescription).id = "assbin";
    ((iVar2._M_current)->mDescription).description = "Assimp Binary File";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "assxml";
  local_60.mDescription.description = "Assimp XML Document";
  local_60.mDescription.fileExtension = "assxml";
  local_60.mExportFunction = ExportSceneAssxml;
  local_60.mEnforcePP = 0;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = (ulong)(uint)local_60._36_4_ << 0x20;
    ((iVar2._M_current)->mDescription).fileExtension = "assxml";
    (iVar2._M_current)->mExportFunction = ExportSceneAssxml;
    ((iVar2._M_current)->mDescription).id = "assxml";
    ((iVar2._M_current)->mDescription).description = "Assimp XML Document";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "x3d";
  local_60.mDescription.description = "Extensible 3D";
  local_60.mDescription.fileExtension = "x3d";
  local_60.mExportFunction = ExportSceneX3D;
  local_60.mEnforcePP = 0;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = (ulong)(uint)local_60._36_4_ << 0x20;
    ((iVar2._M_current)->mDescription).fileExtension = "x3d";
    (iVar2._M_current)->mExportFunction = ExportSceneX3D;
    ((iVar2._M_current)->mDescription).id = "x3d";
    ((iVar2._M_current)->mDescription).description = "Extensible 3D";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "fbx";
  local_60.mDescription.description = "Autodesk FBX (binary)";
  local_60.mDescription.fileExtension = "fbx";
  local_60.mExportFunction = ExportSceneFBX;
  local_60.mEnforcePP = 0;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = (ulong)(uint)local_60._36_4_ << 0x20;
    ((iVar2._M_current)->mDescription).fileExtension = "fbx";
    (iVar2._M_current)->mExportFunction = ExportSceneFBX;
    ((iVar2._M_current)->mDescription).id = "fbx";
    ((iVar2._M_current)->mDescription).description = "Autodesk FBX (binary)";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "fbxa";
  local_60.mDescription.description = "Autodesk FBX (ascii)";
  local_60.mDescription.fileExtension = "fbx";
  local_60.mExportFunction = ExportSceneFBXA;
  local_60.mEnforcePP = 0;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = (ulong)(uint)local_60._36_4_ << 0x20;
    ((iVar2._M_current)->mDescription).fileExtension = "fbx";
    (iVar2._M_current)->mExportFunction = ExportSceneFBXA;
    ((iVar2._M_current)->mDescription).id = "fbxa";
    ((iVar2._M_current)->mDescription).description = "Autodesk FBX (ascii)";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "m3d";
  local_60.mDescription.description = "Model 3D (binary)";
  local_60.mDescription.fileExtension = "m3d";
  local_60.mExportFunction = ExportSceneM3D;
  local_60.mEnforcePP = 0;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = (ulong)(uint)local_60._36_4_ << 0x20;
    ((iVar2._M_current)->mDescription).fileExtension = "m3d";
    (iVar2._M_current)->mExportFunction = ExportSceneM3D;
    ((iVar2._M_current)->mDescription).id = "m3d";
    ((iVar2._M_current)->mDescription).description = "Model 3D (binary)";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "m3da";
  local_60.mDescription.description = "Model 3D (ascii)";
  local_60.mDescription.fileExtension = "a3d";
  local_60.mExportFunction = ExportSceneM3DA;
  local_60.mEnforcePP = 0;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = (ulong)(uint)local_60._36_4_ << 0x20;
    ((iVar2._M_current)->mDescription).fileExtension = "a3d";
    (iVar2._M_current)->mExportFunction = ExportSceneM3DA;
    ((iVar2._M_current)->mDescription).id = "m3da";
    ((iVar2._M_current)->mDescription).description = "Model 3D (ascii)";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "3mf";
  local_60.mDescription.description = "The 3MF-File-Format";
  local_60.mDescription.fileExtension = "3mf";
  local_60.mExportFunction = ExportScene3MF;
  local_60.mEnforcePP = 0;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = (ulong)(uint)local_60._36_4_ << 0x20;
    ((iVar2._M_current)->mDescription).fileExtension = "3mf";
    (iVar2._M_current)->mExportFunction = ExportScene3MF;
    ((iVar2._M_current)->mDescription).id = "3mf";
    ((iVar2._M_current)->mDescription).description = "The 3MF-File-Format";
    iVar2._M_current =
         (this->mExporters).
         super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->mExporters).
    super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_60.mDescription.id = "assjson";
  local_60.mDescription.description = "Assimp JSON Document";
  local_60.mDescription.fileExtension = "json";
  local_60.mExportFunction = ExportAssimp2Json;
  local_60.mEnforcePP = 0;
  if (iVar2._M_current ==
      (this->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry>(this_00,iVar2,&local_60);
  }
  else {
    *(ulong *)&(iVar2._M_current)->mEnforcePP = (ulong)(uint)local_60._36_4_ << 0x20;
    ((iVar2._M_current)->mDescription).fileExtension = "json";
    (iVar2._M_current)->mExportFunction = ExportAssimp2Json;
    ((iVar2._M_current)->mDescription).id = "assjson";
    ((iVar2._M_current)->mDescription).description = "Assimp JSON Document";
    ppEVar1 = &(this->mExporters).
               super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
  return;
}

Assistant:

ExporterPimpl()
    : blob()
    , mIOSystem(new Assimp::DefaultIOSystem())
    , mIsDefaultIOHandler(true)
    , mProgressHandler( nullptr )
    , mIsDefaultProgressHandler( true )
    , mPostProcessingSteps()
    , mError()
    , mExporters() {
        GetPostProcessingStepInstanceList(mPostProcessingSteps);

        // grab all built-in exporters
		setupExporterArray(mExporters);
    }